

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseClient.cpp
# Opt level: O0

bool __thiscall
xmrig::BaseClient::handleResponse(BaseClient *this,int64_t id,Value *result,Value *error)

{
  bool bVar1;
  map<long,_xmrig::BaseClient::SendResult,_std::less<long>,_std::allocator<std::pair<const_long,_xmrig::BaseClient::SendResult>_>_>
  *this_00;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_RCX;
  long in_RSI;
  iterator in_RDI;
  uint64_t elapsed;
  iterator it;
  map<long,_xmrig::BaseClient::SendResult,_std::less<long>,_std::allocator<std::pair<const_long,_xmrig::BaseClient::SendResult>_>_>
  *in_stack_ffffffffffffff98;
  function<void_(const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_&,_bool,_unsigned_long)>
  *in_stack_ffffffffffffffb0;
  _Self local_38;
  _Self local_30;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *local_28;
  bool local_1;
  
  if (in_RSI == 1) {
    local_1 = false;
  }
  else {
    local_28 = in_RCX;
    local_30._M_node =
         (_Base_ptr)
         std::
         map<long,_xmrig::BaseClient::SendResult,_std::less<long>,_std::allocator<std::pair<const_long,_xmrig::BaseClient::SendResult>_>_>
         ::find(in_stack_ffffffffffffff98,(key_type_conflict *)0x1bcf6a);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<long,_xmrig::BaseClient::SendResult,_std::less<long>,_std::allocator<std::pair<const_long,_xmrig::BaseClient::SendResult>_>_>
         ::end(in_stack_ffffffffffffff98);
    bVar1 = std::operator!=(&local_30,&local_38);
    if (bVar1) {
      this_00 = (map<long,_xmrig::BaseClient::SendResult,_std::less<long>,_std::allocator<std::pair<const_long,_xmrig::BaseClient::SendResult>_>_>
                 *)Chrono::steadyMSecs();
      std::_Rb_tree_iterator<std::pair<const_long,_xmrig::BaseClient::SendResult>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_long,_xmrig::BaseClient::SendResult>_> *)this_00
                );
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsObject(local_28);
      if (bVar1) {
        std::_Rb_tree_iterator<std::pair<const_long,_xmrig::BaseClient::SendResult>_>::operator->
                  ((_Rb_tree_iterator<std::pair<const_long,_xmrig::BaseClient::SendResult>_> *)
                   this_00);
        std::
        function<void_(const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_&,_bool,_unsigned_long)>
        ::operator()(in_stack_ffffffffffffffb0,
                     (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)in_RDI._M_node,SUB81((ulong)this_00 >> 0x38,0),
                     (unsigned_long)in_stack_ffffffffffffff98);
      }
      else {
        std::_Rb_tree_iterator<std::pair<const_long,_xmrig::BaseClient::SendResult>_>::operator->
                  ((_Rb_tree_iterator<std::pair<const_long,_xmrig::BaseClient::SendResult>_> *)
                   this_00);
        std::
        function<void_(const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_&,_bool,_unsigned_long)>
        ::operator()(in_stack_ffffffffffffffb0,
                     (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)in_RDI._M_node,SUB81((ulong)this_00 >> 0x38,0),
                     (unsigned_long)in_stack_ffffffffffffff98);
      }
      std::
      map<long,xmrig::BaseClient::SendResult,std::less<long>,std::allocator<std::pair<long_const,xmrig::BaseClient::SendResult>>>
      ::erase_abi_cxx11_(this_00,in_RDI);
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool xmrig::BaseClient::handleResponse(int64_t id, const rapidjson::Value &result, const rapidjson::Value &error)
{
    if (id == 1) {
        return false;
    }

    auto it = m_callbacks.find(id);
    if (it != m_callbacks.end()) {
        const uint64_t elapsed = Chrono::steadyMSecs() - it->second.ts;

        if (error.IsObject()) {
            it->second.callback(error, false, elapsed);
        }
        else {
            it->second.callback(result, true, elapsed);
        }

        m_callbacks.erase(it);

        return true;
    }

    return false;
}